

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O1

void __thiscall QGles2CommandBuffer::~QGles2CommandBuffer(QGles2CommandBuffer *this)

{
  undefined1 *puVar1;
  Command *pCVar2;
  undefined8 *puVar3;
  QRhiBufferData *this_00;
  long lVar4;
  
  (this->super_QRhiCommandBuffer).super_QRhiResource._vptr_QRhiResource =
       (_func_int **)&PTR__QGles2CommandBuffer_007efd38;
  lVar4 = (this->imageRetainPool).super_QVLABase<QImage>.super_QVLABaseBase.s;
  if (0 < lVar4) {
    puVar3 = (undefined8 *)(this->imageRetainPool).super_QVLABase<QImage>.super_QVLABaseBase.ptr;
    lVar4 = lVar4 + 1;
    do {
      (**(code **)*puVar3)(puVar3);
      puVar3 = puVar3 + 3;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  puVar1 = (undefined1 *)(this->imageRetainPool).super_QVLABase<QImage>.super_QVLABaseBase.ptr;
  if ((QVLAStorage<24UL,_8UL,_4LL> *)puVar1 !=
      &(this->imageRetainPool).super_QVLAStorage<24UL,_8UL,_4LL>) {
    QtPrivate::sizedFree
              (puVar1,(this->imageRetainPool).super_QVLABase<QImage>.super_QVLABaseBase.a * 0x18);
  }
  lVar4 = (this->bufferDataRetainPool).super_QVLABase<QRhiBufferData>.super_QVLABaseBase.s;
  if (0 < lVar4) {
    this_00 = (QRhiBufferData *)
              (this->bufferDataRetainPool).super_QVLABase<QRhiBufferData>.super_QVLABaseBase.ptr;
    lVar4 = lVar4 + 1;
    do {
      QRhiBufferData::~QRhiBufferData(this_00);
      this_00 = this_00 + 1;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  puVar1 = (undefined1 *)
           (this->bufferDataRetainPool).super_QVLABase<QRhiBufferData>.super_QVLABaseBase.ptr;
  if ((QVLAStorage<8UL,_8UL,_4LL> *)puVar1 !=
      &(this->bufferDataRetainPool).super_QVLAStorage<8UL,_8UL,_4LL>) {
    QtPrivate::sizedFree
              (puVar1,(this->bufferDataRetainPool).super_QVLABase<QRhiBufferData>.super_QVLABaseBase
                      .a << 3);
  }
  std::_Destroy_n_aux<false>::__destroy_n<QByteArray*,long_long>
            ((QByteArray *)(this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.ptr,
             (this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.s);
  puVar1 = (undefined1 *)(this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.ptr;
  if ((QVLAStorage<24UL,_8UL,_4LL> *)puVar1 !=
      &(this->dataRetainPool).super_QVLAStorage<24UL,_8UL,_4LL>) {
    QtPrivate::sizedFree
              (puVar1,(this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.a * 0x18)
    ;
  }
  QHash<QRhiResource_*,_std::pair<int,_bool>_>::~QHash(&(this->computePassState).writtenResources);
  std::_Destroy_n_aux<false>::__destroy_n<QRhiPassResourceTracker*,long_long>
            ((QRhiPassResourceTracker *)
             (this->passResTrackers).super_QVLABase<QRhiPassResourceTracker>.super_QVLABaseBase.ptr,
             (this->passResTrackers).super_QVLABase<QRhiPassResourceTracker>.super_QVLABaseBase.s);
  puVar1 = (undefined1 *)
           (this->passResTrackers).super_QVLABase<QRhiPassResourceTracker>.super_QVLABaseBase.ptr;
  if ((QVLAStorage<16UL,_8UL,_8LL> *)puVar1 !=
      &(this->passResTrackers).super_QVLAStorage<16UL,_8UL,_8LL>) {
    QtPrivate::sizedFree
              (puVar1,(this->passResTrackers).super_QVLABase<QRhiPassResourceTracker>.
                      super_QVLABaseBase.a << 4);
  }
  pCVar2 = (this->commands).v;
  if (pCVar2 != (Command *)0x0) {
    operator_delete__(pCVar2);
  }
  QRhiResource::~QRhiResource((QRhiResource *)this);
  return;
}

Assistant:

QGles2CommandBuffer::~QGles2CommandBuffer()
{
    destroy();
}